

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::UnserializeFloat(IMkvReader *pReader,longlong pos,longlong size_,double *result)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  double *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int i_1;
  double d;
  int i;
  float f;
  int status;
  uchar buf [8];
  long size;
  int local_54;
  ulong local_50;
  int local_44;
  uint local_40;
  byte local_38 [8];
  long local_30;
  double *local_28;
  long local_8;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RSI < 0)) || ((in_RDX != 4 && (in_RDX != 8)))) {
    local_8 = -2;
  }
  else {
    local_30 = in_RDX;
    local_28 = in_RCX;
    iVar1 = (**(code **)*in_RDI)(in_RDI,in_RSI,in_RDX,local_38);
    if (iVar1 < 0) {
      local_8 = (long)iVar1;
    }
    else {
      if (local_30 == 4) {
        local_40 = 0;
        local_44 = 0;
        while( true ) {
          lVar3 = (long)local_44;
          local_44 = local_44 + 1;
          if (3 < local_44) break;
          local_40 = (local_38[lVar3] | local_40) << 8;
        }
        *local_28 = (double)(float)(local_38[lVar3] | local_40);
      }
      else {
        local_50 = 0;
        local_54 = 0;
        while( true ) {
          lVar3 = (long)local_54;
          local_54 = local_54 + 1;
          if (7 < local_54) break;
          local_50 = (local_38[lVar3] | local_50) << 8;
        }
        *local_28 = (double)(local_38[lVar3] | local_50);
      }
      uVar2 = isinf(*local_28);
      if (((uVar2 & 1) == 0) && (uVar2 = isnan(*local_28), (uVar2 & 1) == 0)) {
        return 0;
      }
      local_8 = -2;
    }
  }
  return local_8;
}

Assistant:

long UnserializeFloat(IMkvReader* pReader, long long pos, long long size_,
                      double& result) {
  if (!pReader || pos < 0 || ((size_ != 4) && (size_ != 8)))
    return E_FILE_FORMAT_INVALID;

  const long size = static_cast<long>(size_);

  unsigned char buf[8];

  const int status = pReader->Read(pos, size, buf);

  if (status < 0)  // error
    return status;

  if (size == 4) {
    union {
      float f;
      uint32_t ff;
      static_assert(sizeof(float) == sizeof(uint32_t), "");
    };

    ff = 0;

    for (int i = 0;;) {
      ff |= buf[i];

      if (++i >= 4)
        break;

      ff <<= 8;
    }

    result = f;
  } else {
    union {
      double d;
      uint64_t dd;
      static_assert(sizeof(double) == sizeof(uint64_t), "");
    };

    dd = 0;

    for (int i = 0;;) {
      dd |= buf[i];

      if (++i >= 8)
        break;

      dd <<= 8;
    }

    result = d;
  }

  if (mkvparser::isinf(result) || mkvparser::isnan(result))
    return E_FILE_FORMAT_INVALID;

  return 0;
}